

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_exception_primitive_printString
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  if (*(sysbvm_tuple_t *)(*arguments + 0x10) != 0) {
    return *(sysbvm_tuple_t *)(*arguments + 0x10);
  }
  sVar1 = sysbvm_string_createWithCString(context,"An exception");
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_exception_primitive_printString(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_exception_t *exceptionObject = (sysbvm_exception_t*)arguments[0];
    if(exceptionObject->messageText)
        return exceptionObject->messageText;

    return sysbvm_string_createWithCString(context, "An exception");
}